

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

bool __thiscall wabt::WastParser::PeekIsCustom(WastParser *this)

{
  bool bVar1;
  Token *this_00;
  bool local_39;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_38;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  _Type local_18;
  WastParser *local_10;
  WastParser *this_local;
  
  local_10 = this;
  bVar1 = Features::annotations_enabled(&this->options_->features);
  local_39 = false;
  if (bVar1) {
    local_18 = (_Type)PeekPair(this);
    bVar1 = anon_unknown_1::IsLparAnn((TokenTypePair)local_18);
    local_39 = false;
    if (bVar1) {
      this_00 = TokenQueue::front(&this->tokens_);
      local_28 = Token::text(this_00);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,"custom");
      local_39 = std::operator==(local_28,local_38);
    }
  }
  return local_39;
}

Assistant:

bool WastParser::PeekIsCustom() {
  // If IsLparAnn succeeds, tokens_.front() must have text, as it is an LparAnn
  // token.
  return options_->features.annotations_enabled() && IsLparAnn(PeekPair()) &&
         tokens_.front().text() == "custom";
}